

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

BOOL check_fast_forward_char_pair_sse2
               (compiler_common *common,fast_forward_char_data *chars,int max)

{
  PCRE2_UCHAR16 char1a;
  PCRE2_UCHAR16 char1b;
  PCRE2_UCHAR16 char2a;
  PCRE2_UCHAR16 char2b;
  sljit_u32 sVar1;
  PCRE2_UCHAR16 b2;
  PCRE2_UCHAR16 b1;
  PCRE2_UCHAR16 a2;
  PCRE2_UCHAR16 a1;
  sljit_u32 priorities;
  sljit_s32 count;
  sljit_s32 priority;
  sljit_s32 j;
  sljit_s32 i;
  int max_local;
  fast_forward_char_data *chars_local;
  compiler_common *common_local;
  
  _b2 = 0;
  _a2 = 0;
  for (priority = 0; priority < max; priority = priority + 1) {
    if (2 < chars[priority].last_count) {
      _b2 = 1 << (chars[priority].last_count & 0x1f) | _b2;
      _a2 = _a2 + 1;
    }
  }
  if (1 < _a2) {
    for (priorities = 7; 2 < (int)priorities; priorities = priorities - 1) {
      if ((_b2 & 1 << ((byte)priorities & 0x1f)) != 0) {
        for (priority = max + -1; 0 < priority; priority = priority + -1) {
          if ((int)priorities <= (int)(uint)chars[priority].last_count) {
            char1a = chars[priority].chars[0];
            char1b = chars[priority].chars[1];
            sVar1 = max_fast_forward_char_pair_sse2_offset();
            count = priority - sVar1;
            if (count < 0) {
              count = 0;
            }
            for (; count < priority; count = count + 1) {
              if ((int)priorities <= (int)(uint)chars[count].last_count) {
                char2a = chars[count].chars[0];
                char2b = chars[count].chars[1];
                if ((((char1a != char2a) && (char1a != char2b)) && (char1b != char2a)) &&
                   (char1b != char2b)) {
                  fast_forward_char_pair_sse2(common,priority,char1a,char1b,count,char2a,char2b);
                  return 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static BOOL check_fast_forward_char_pair_sse2(compiler_common *common, fast_forward_char_data *chars, int max)
{
sljit_s32 i, j, priority, count;
sljit_u32 priorities;
PCRE2_UCHAR a1, a2, b1, b2;

priorities = 0;

count = 0;
for (i = 0; i < max; i++)
  {
  if (chars[i].last_count > 2)
    {
    SLJIT_ASSERT(chars[i].last_count <= 7);

    priorities |= (1 << chars[i].last_count);
    count++;
    }
  }

if (count < 2)
  return FALSE;

for (priority = 7; priority > 2; priority--)
  {
  if ((priorities & (1 << priority)) == 0)
    continue;

  for (i = max - 1; i >= 1; i--)
    if (chars[i].last_count >= priority)
      {
      SLJIT_ASSERT(chars[i].count <= 2 && chars[i].count >= 1);

      a1 = chars[i].chars[0];
      a2 = chars[i].chars[1];

      j = i - max_fast_forward_char_pair_sse2_offset();
      if (j < 0)
        j = 0;

      while (j < i)
        {
        if (chars[j].last_count >= priority)
          {
          b1 = chars[j].chars[0];
          b2 = chars[j].chars[1];

          if (a1 != b1 && a1 != b2 && a2 != b1 && a2 != b2)
            {
            fast_forward_char_pair_sse2(common, i, a1, a2, j, b1, b2);
            return TRUE;
            }
          }
        j++;
        }
      }
  }

return FALSE;
}